

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampTexParameterIErrors.cpp
# Opt level: O1

IterateResult __thiscall
glcts::TextureBorderClampTexParameterIErrorsTest::iterate
          (TextureBorderClampTexParameterIErrorsTest *this)

{
  char *description;
  bool bVar1;
  
  (*(this->super_TextureBorderClampBase).super_TestCaseBase.super_TestCase.super_TestNode.
    _vptr_TestNode[5])();
  if ((this->super_TextureBorderClampBase).super_TestCaseBase.m_is_texture_buffer_supported == true)
  {
    VerifyGLTexParameterIiv
              (this,(this->super_TextureBorderClampBase).super_TestCaseBase.m_glExtTokens.
                    TEXTURE_BUFFER,0x813c,1,0x500);
    VerifyGLTexParameterIuiv
              (this,(this->super_TextureBorderClampBase).super_TestCaseBase.m_glExtTokens.
                    TEXTURE_BUFFER,0x813c,1,0x500);
  }
  VerifyGLTexParameterIiv(this,0x8515,0x813c,1,0x500);
  VerifyGLTexParameterIuiv(this,0x8515,0x813c,1,0x500);
  VerifyGLTexParameterIivForAll(this,0x912f,1,0x500);
  VerifyGLTexParameterIuivForAll(this,0x912f,1,0x500);
  VerifyGLTexParameterIivTextureBaseLevelForAll(this,0x813c,-1,0x501);
  VerifyGLTexParameterIivForAll(this,0x813d,-1,0x501);
  VerifyGLTexParameterIivForAll(this,0x884c,0x2600,0x500);
  VerifyGLTexParameterIuivForAll(this,0x884c,0x2600,0x500);
  VerifyGLTexParameterIivForAll(this,0x884d,0x2600,0x500);
  VerifyGLTexParameterIuivForAll(this,0x884d,0x2600,0x500);
  VerifyGLTexParameterIivForAll(this,0x2800,0x2700,0x500);
  VerifyGLTexParameterIuivForAll(this,0x2800,0x2700,0x500);
  VerifyGLTexParameterIivForAll(this,0x2801,0x1903,0x500);
  VerifyGLTexParameterIuivForAll(this,0x2801,0x1903,0x500);
  VerifyGLTexParameterIivForAll(this,0x8e42,0x2600,0x500);
  VerifyGLTexParameterIuivForAll(this,0x8e42,0x2600,0x500);
  VerifyGLTexParameterIivForAll(this,0x8e43,0x2600,0x500);
  VerifyGLTexParameterIuivForAll(this,0x8e43,0x2600,0x500);
  VerifyGLTexParameterIivForAll(this,0x8e44,0x2600,0x500);
  VerifyGLTexParameterIuivForAll(this,0x8e44,0x2600,0x500);
  VerifyGLTexParameterIivForAll(this,0x8e45,0x2600,0x500);
  VerifyGLTexParameterIuivForAll(this,0x8e45,0x2600,0x500);
  VerifyGLTexParameterIivForAll(this,0x2802,0x1903,0x500);
  VerifyGLTexParameterIuivForAll(this,0x2802,0x1903,0x500);
  VerifyGLTexParameterIivForAll(this,0x2803,0x1903,0x500);
  VerifyGLTexParameterIuivForAll(this,0x2803,0x1903,0x500);
  VerifyGLTexParameterIivForAll(this,0x8072,0x1903,0x500);
  VerifyGLTexParameterIuivForAll(this,0x8072,0x1903,0x500);
  if ((this->super_TextureBorderClampBase).super_TestCaseBase.
      m_is_texture_storage_multisample_supported == true) {
    VerifyGLTexParameterIiv(this,0x9100,0x884c,0,0x500);
    VerifyGLTexParameterIuiv(this,0x9100,0x884c,0,0x500);
    VerifyGLTexParameterIiv(this,0x9100,0x884d,0x203,0x500);
    VerifyGLTexParameterIuiv(this,0x9100,0x884d,0x203,0x500);
    VerifyGLTexParameterIiv(this,0x9100,0x2800,0x2601,0x500);
    VerifyGLTexParameterIuiv(this,0x9100,0x2800,0x2601,0x500);
    VerifyGLTexParameterIiv(this,0x9100,0x813b,1000,0x500);
    VerifyGLTexParameterIuiv(this,0x9100,0x813b,1000,0x500);
    VerifyGLTexParameterIiv(this,0x9100,0x2801,0x2702,0x500);
    VerifyGLTexParameterIuiv(this,0x9100,0x2801,0x2702,0x500);
    VerifyGLTexParameterIiv(this,0x9100,0x813a,-1000,0x500);
    VerifyGLTexParameterIiv(this,0x9100,0x2802,0x2901,0x500);
    VerifyGLTexParameterIuiv(this,0x9100,0x2802,0x2901,0x500);
    VerifyGLTexParameterIiv(this,0x9100,0x2803,0x2901,0x500);
    VerifyGLTexParameterIuiv(this,0x9100,0x2803,0x2901,0x500);
    VerifyGLTexParameterIiv(this,0x9100,0x8072,0x2901,0x500);
    VerifyGLTexParameterIuiv(this,0x9100,0x8072,0x2901,0x500);
  }
  if ((this->super_TextureBorderClampBase).super_TestCaseBase.
      m_is_texture_storage_multisample_2d_array_supported == true) {
    VerifyGLTexParameterIiv(this,0x9102,0x884c,0,0x500);
    VerifyGLTexParameterIuiv(this,0x9102,0x884c,0,0x500);
    VerifyGLTexParameterIiv(this,0x9102,0x884d,0x203,0x500);
    VerifyGLTexParameterIuiv(this,0x9102,0x884d,0x203,0x500);
    VerifyGLTexParameterIiv(this,0x9102,0x2800,0x2601,0x500);
    VerifyGLTexParameterIuiv(this,0x9102,0x2800,0x2601,0x500);
    VerifyGLTexParameterIiv(this,0x9102,0x813b,1000,0x500);
    VerifyGLTexParameterIuiv(this,0x9102,0x813b,1000,0x500);
    VerifyGLTexParameterIiv(this,0x9102,0x2801,0x2702,0x500);
    VerifyGLTexParameterIuiv(this,0x9102,0x2801,0x2702,0x500);
    VerifyGLTexParameterIiv(this,0x9102,0x813a,-1000,0x500);
    VerifyGLTexParameterIiv(this,0x9102,0x2802,0x2901,0x500);
    VerifyGLTexParameterIuiv(this,0x9102,0x2802,0x2901,0x500);
    VerifyGLTexParameterIiv(this,0x9102,0x2803,0x2901,0x500);
    VerifyGLTexParameterIuiv(this,0x9102,0x2803,0x2901,0x500);
    VerifyGLTexParameterIiv(this,0x9102,0x8072,0x2901,0x500);
    VerifyGLTexParameterIuiv(this,0x9102,0x8072,0x2901,0x500);
  }
  bVar1 = this->m_test_passed == '\0';
  if (bVar1) {
    description = "Fail";
  }
  else {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TextureBorderClampBase).super_TestCaseBase.super_TestCase.super_TestNode.
             m_testCtx,(uint)bVar1,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TextureBorderClampTexParameterIErrorsTest::iterate(void)
{
	initTest();

	/* Make sure that the functions report GL_INVALID_ENUM error if cube-map
	 *  face or GL_TEXTURE_BUFFER_EXT texture targets (if supported) is issued as
	 *  a texture target.*/
	if (m_is_texture_buffer_supported)
	{
		VerifyGLTexParameterIiv(m_glExtTokens.TEXTURE_BUFFER, GL_TEXTURE_BASE_LEVEL, 1, GL_INVALID_ENUM);
		VerifyGLTexParameterIuiv(m_glExtTokens.TEXTURE_BUFFER, GL_TEXTURE_BASE_LEVEL, 1, GL_INVALID_ENUM);
	}

	VerifyGLTexParameterIiv(GL_TEXTURE_CUBE_MAP_POSITIVE_X, GL_TEXTURE_BASE_LEVEL, 1, GL_INVALID_ENUM);
	VerifyGLTexParameterIuiv(GL_TEXTURE_CUBE_MAP_POSITIVE_X, GL_TEXTURE_BASE_LEVEL, 1, GL_INVALID_ENUM);

	/* Make sure that the functions report GL_INVALID_ENUM error if
	 * GL_TEXTURE_IMMUTABLE_FORMAT is passed by pname argument.*/
	VerifyGLTexParameterIivForAll(GL_TEXTURE_IMMUTABLE_FORMAT, 1, GL_INVALID_ENUM);
	VerifyGLTexParameterIuivForAll(GL_TEXTURE_IMMUTABLE_FORMAT, 1, GL_INVALID_ENUM);

	/* Make sure that the functions report GL_INVALID_VALUE error if the following
	 * pname+value combinations are used: */

	/* GL_TEXTURE_BASE_LEVEL  -1 (iv() version only)*/
	VerifyGLTexParameterIivTextureBaseLevelForAll(GL_TEXTURE_BASE_LEVEL, -1, GL_INVALID_VALUE);
	/* GL_TEXTURE_MAX_LEVEL, -1; (iv() version only) */
	VerifyGLTexParameterIivForAll(GL_TEXTURE_MAX_LEVEL, -1, GL_INVALID_VALUE);

	/* Make sure that the functions report GL_INVALID_ENUM error if the following
	 * pname+value combinations are used: */

	/* GL_TEXTURE_COMPARE_MODE, GL_NEAREST */
	VerifyGLTexParameterIivForAll(GL_TEXTURE_COMPARE_MODE, GL_NEAREST, GL_INVALID_ENUM);
	VerifyGLTexParameterIuivForAll(GL_TEXTURE_COMPARE_MODE, GL_NEAREST, GL_INVALID_ENUM);

	/* GL_TEXTURE_COMPARE_FUNC, GL_NEAREST;*/
	VerifyGLTexParameterIivForAll(GL_TEXTURE_COMPARE_FUNC, GL_NEAREST, GL_INVALID_ENUM);
	VerifyGLTexParameterIuivForAll(GL_TEXTURE_COMPARE_FUNC, GL_NEAREST, GL_INVALID_ENUM);

	/* GL_TEXTURE_MAG_FILTER, GL_NEAREST_MIPMAP_NEAREST;*/
	VerifyGLTexParameterIivForAll(GL_TEXTURE_MAG_FILTER, GL_NEAREST_MIPMAP_NEAREST, GL_INVALID_ENUM);
	VerifyGLTexParameterIuivForAll(GL_TEXTURE_MAG_FILTER, GL_NEAREST_MIPMAP_NEAREST, GL_INVALID_ENUM);

	/* GL_TEXTURE_MIN_FILTER, GL_RED */
	VerifyGLTexParameterIivForAll(GL_TEXTURE_MIN_FILTER, GL_RED, GL_INVALID_ENUM);
	VerifyGLTexParameterIuivForAll(GL_TEXTURE_MIN_FILTER, GL_RED, GL_INVALID_ENUM);

	/* GL_TEXTURE_SWIZZLE_R, GL_NEAREST */
	VerifyGLTexParameterIivForAll(GL_TEXTURE_SWIZZLE_R, GL_NEAREST, GL_INVALID_ENUM);
	VerifyGLTexParameterIuivForAll(GL_TEXTURE_SWIZZLE_R, GL_NEAREST, GL_INVALID_ENUM);

	/* GL_TEXTURE_SWIZZLE_G, GL_NEAREST */
	VerifyGLTexParameterIivForAll(GL_TEXTURE_SWIZZLE_G, GL_NEAREST, GL_INVALID_ENUM);
	VerifyGLTexParameterIuivForAll(GL_TEXTURE_SWIZZLE_G, GL_NEAREST, GL_INVALID_ENUM);

	/* GL_TEXTURE_SWIZZLE_B, GL_NEAREST */
	VerifyGLTexParameterIivForAll(GL_TEXTURE_SWIZZLE_B, GL_NEAREST, GL_INVALID_ENUM);
	VerifyGLTexParameterIuivForAll(GL_TEXTURE_SWIZZLE_B, GL_NEAREST, GL_INVALID_ENUM);

	/* GL_TEXTURE_SWIZZLE_A, GL_NEAREST */
	VerifyGLTexParameterIivForAll(GL_TEXTURE_SWIZZLE_A, GL_NEAREST, GL_INVALID_ENUM);
	VerifyGLTexParameterIuivForAll(GL_TEXTURE_SWIZZLE_A, GL_NEAREST, GL_INVALID_ENUM);

	/* GL_TEXTURE_WRAP_S, GL_RED */
	VerifyGLTexParameterIivForAll(GL_TEXTURE_WRAP_S, GL_RED, GL_INVALID_ENUM);
	VerifyGLTexParameterIuivForAll(GL_TEXTURE_WRAP_S, GL_RED, GL_INVALID_ENUM);

	/* GL_TEXTURE_WRAP_T, GL_RED */
	VerifyGLTexParameterIivForAll(GL_TEXTURE_WRAP_T, GL_RED, GL_INVALID_ENUM);
	VerifyGLTexParameterIuivForAll(GL_TEXTURE_WRAP_T, GL_RED, GL_INVALID_ENUM);

	/* GL_TEXTURE_WRAP_R, GL_RED */
	VerifyGLTexParameterIivForAll(GL_TEXTURE_WRAP_R, GL_RED, GL_INVALID_ENUM);
	VerifyGLTexParameterIuivForAll(GL_TEXTURE_WRAP_R, GL_RED, GL_INVALID_ENUM);

	/* Make sure that the functions report GL_INVALID_ENUM error if the following
	 * pname+value pairs are used for GL_TEXTURE_2D_MULTISAMPLE or
	 * GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES targets: */
	if (m_is_texture_storage_multisample_supported)
	{
		/* GL_TEXTURE_COMPARE_MODE, GL_NONE */
		VerifyGLTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_COMPARE_MODE, GL_NONE, GL_INVALID_ENUM);
		VerifyGLTexParameterIuiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_COMPARE_MODE, GL_NONE, GL_INVALID_ENUM);

		/* GL_TEXTURE_COMPARE_FUNC, GL_LEQUAL */
		VerifyGLTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_COMPARE_FUNC, GL_LEQUAL, GL_INVALID_ENUM);
		VerifyGLTexParameterIuiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_COMPARE_FUNC, GL_LEQUAL, GL_INVALID_ENUM);

		/* GL_TEXTURE_MAG_FILTER, GL_LINEAR */
		VerifyGLTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MAG_FILTER, GL_LINEAR, GL_INVALID_ENUM);
		VerifyGLTexParameterIuiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MAG_FILTER, GL_LINEAR, GL_INVALID_ENUM);

		/* GL_TEXTURE_MAX_LOD, 1000 */
		VerifyGLTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MAX_LOD, 1000, GL_INVALID_ENUM);
		VerifyGLTexParameterIuiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MAX_LOD, 1000, GL_INVALID_ENUM);

		/* GL_TEXTURE_MIN_FILTER, GL_NEAREST_MIPMAP_LINEAR */
		VerifyGLTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MIN_FILTER, GL_NEAREST_MIPMAP_LINEAR,
								GL_INVALID_ENUM);
		VerifyGLTexParameterIuiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MIN_FILTER, GL_NEAREST_MIPMAP_LINEAR,
								 GL_INVALID_ENUM);

		/* GL_TEXTURE_MIN_LOD, -1000 */
		VerifyGLTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MIN_LOD, -1000, GL_INVALID_ENUM);

		/* GL_TEXTURE_WRAP_S, GL_REPEAT */
		VerifyGLTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_WRAP_S, GL_REPEAT, GL_INVALID_ENUM);
		VerifyGLTexParameterIuiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_WRAP_S, GL_REPEAT, GL_INVALID_ENUM);

		/* GL_TEXTURE_WRAP_T, GL_REPEAT */
		VerifyGLTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_WRAP_T, GL_REPEAT, GL_INVALID_ENUM);
		VerifyGLTexParameterIuiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_WRAP_T, GL_REPEAT, GL_INVALID_ENUM);

		/* GL_TEXTURE_WRAP_R, GL_REPEAT */
		VerifyGLTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_WRAP_R, GL_REPEAT, GL_INVALID_ENUM);
		VerifyGLTexParameterIuiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_WRAP_R, GL_REPEAT, GL_INVALID_ENUM);

	} /* if (m_is_texture_storage_multisample_supported) */

	if (m_is_texture_storage_multisample_2d_array_supported)
	{
		/* GL_TEXTURE_COMPARE_MODE, GL_NONE */
		VerifyGLTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, GL_TEXTURE_COMPARE_MODE, GL_NONE, GL_INVALID_ENUM);
		VerifyGLTexParameterIuiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, GL_TEXTURE_COMPARE_MODE, GL_NONE,
								 GL_INVALID_ENUM);

		/* GL_TEXTURE_COMPARE_FUNC, GL_LEQUAL */
		VerifyGLTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, GL_TEXTURE_COMPARE_FUNC, GL_LEQUAL,
								GL_INVALID_ENUM);
		VerifyGLTexParameterIuiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, GL_TEXTURE_COMPARE_FUNC, GL_LEQUAL,
								 GL_INVALID_ENUM);

		/* GL_TEXTURE_MAG_FILTER, GL_LINEAR */
		VerifyGLTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, GL_TEXTURE_MAG_FILTER, GL_LINEAR, GL_INVALID_ENUM);
		VerifyGLTexParameterIuiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, GL_TEXTURE_MAG_FILTER, GL_LINEAR,
								 GL_INVALID_ENUM);

		/* GL_TEXTURE_MAX_LOD, 1000 */
		VerifyGLTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, GL_TEXTURE_MAX_LOD, 1000, GL_INVALID_ENUM);
		VerifyGLTexParameterIuiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, GL_TEXTURE_MAX_LOD, 1000, GL_INVALID_ENUM);

		/* GL_TEXTURE_MIN_FILTER, GL_NEAREST_MIPMAP_LINEAR */
		VerifyGLTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, GL_TEXTURE_MIN_FILTER, GL_NEAREST_MIPMAP_LINEAR,
								GL_INVALID_ENUM);
		VerifyGLTexParameterIuiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, GL_TEXTURE_MIN_FILTER, GL_NEAREST_MIPMAP_LINEAR,
								 GL_INVALID_ENUM);

		/* GL_TEXTURE_MIN_LOD, -1000 */
		VerifyGLTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, GL_TEXTURE_MIN_LOD, -1000, GL_INVALID_ENUM);

		/* GL_TEXTURE_WRAP_S, GL_REPEAT */
		VerifyGLTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, GL_TEXTURE_WRAP_S, GL_REPEAT, GL_INVALID_ENUM);
		VerifyGLTexParameterIuiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, GL_TEXTURE_WRAP_S, GL_REPEAT, GL_INVALID_ENUM);

		/* GL_TEXTURE_WRAP_T, GL_REPEAT */
		VerifyGLTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, GL_TEXTURE_WRAP_T, GL_REPEAT, GL_INVALID_ENUM);
		VerifyGLTexParameterIuiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, GL_TEXTURE_WRAP_T, GL_REPEAT, GL_INVALID_ENUM);

		/* GL_TEXTURE_WRAP_R, GL_REPEAT */
		VerifyGLTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, GL_TEXTURE_WRAP_R, GL_REPEAT, GL_INVALID_ENUM);
		VerifyGLTexParameterIuiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, GL_TEXTURE_WRAP_R, GL_REPEAT, GL_INVALID_ENUM);

	} /* if (m_is_texture_storage_multisample_2d_array_supported) */

	if (m_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}